

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayGenerateMipMap.cpp
# Opt level: O3

void __thiscall
glcts::TextureCubeMapArrayGenerateMipMapNonFilterable::deinit
          (TextureCubeMapArrayGenerateMipMapNonFilterable *this)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  pointer pSVar4;
  pointer pSVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  long lVar3;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar3 + 0xb8))(0x9009,0);
  (**(code **)(lVar3 + 0xff0))(0xd05,4);
  (**(code **)(lVar3 + 0xff0))(0xcf5,4);
  pSVar4 = (this->m_non_filterable_texture_configs).
           super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar5 = (this->m_non_filterable_texture_configs).
           super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar5 != pSVar4) {
    uVar7 = 0;
    uVar6 = 1;
    do {
      if (pSVar4[uVar7].m_to_id != 0) {
        (**(code **)(lVar3 + 0x480))(1,&pSVar4[uVar7].m_to_id);
        pSVar4 = (this->m_non_filterable_texture_configs).
                 super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pSVar4[uVar7].m_to_id = 0;
        pSVar5 = (this->m_non_filterable_texture_configs).
                 super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar7 = ((long)pSVar5 - (long)pSVar4 >> 2) * -0x3333333333333333;
      bVar8 = uVar6 <= uVar7;
      lVar1 = uVar7 - uVar6;
      uVar7 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar8 && lVar1 != 0);
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void TextureCubeMapArrayGenerateMipMapNonFilterable::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Restore default bindings */
	gl.bindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, 0);

	/* Restore default pixel pack/unpack settings */
	gl.pixelStorei(GL_PACK_ALIGNMENT, 4);
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, 4);

	/* Delete all textures the test may have created. */
	for (unsigned int n_storage_config = 0; n_storage_config < m_non_filterable_texture_configs.size();
		 ++n_storage_config)
	{
		if (m_non_filterable_texture_configs[n_storage_config].m_to_id != 0)
		{
			gl.deleteTextures(1, &m_non_filterable_texture_configs[n_storage_config].m_to_id);

			m_non_filterable_texture_configs[n_storage_config].m_to_id = 0;
		}
	}

	/* Call base class' deinit() implementation */
	TestCaseBase::deinit();
}